

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

void R_DrawHeightPlanes(double height)

{
  visplane_t *pl;
  double dVar1;
  double dVar2;
  double dVar3;
  DAngle DVar4;
  int iVar5;
  long lVar6;
  
  DVar4.Degrees = ViewAngle.Degrees;
  dVar3 = ViewPos.Z;
  dVar2 = ViewPos.Y;
  dVar1 = ViewPos.X;
  ds_color = 3;
  lVar6 = 0;
  do {
    iVar5 = CurrentSkybox;
    for (pl = visplanes[lVar6]; pl != (visplane_t *)0x0; pl = pl->next) {
      if ((((pl->CurrentSkybox == iVar5) && (pl->CurrentPortalUniq == CurrentPortalUniq)) &&
          (pl->sky < 0)) && ((pl->height).D * (pl->height).negiC == height)) {
        ViewPos.Z = (pl->viewpos).Z;
        ViewPos.X = (pl->viewpos).X;
        ViewPos.Y = (pl->viewpos).Y;
        ViewAngle.Degrees = (pl->viewangle).Degrees;
        MirrorFlags = (WORD)pl->MirrorFlags;
        R_DrawSinglePlane(pl,pl->sky & 0x7fffffff,pl->Additive,true);
        iVar5 = CurrentSkybox;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x80);
  ViewPos.Z = dVar3;
  ViewPos.X = dVar1;
  ViewPos.Y = dVar2;
  ViewAngle = DVar4;
  return;
}

Assistant:

void R_DrawHeightPlanes(double height)
{
	visplane_t *pl;
	int i;

	ds_color = 3;

	DVector3 oViewPos = ViewPos;
	DAngle oViewAngle = ViewAngle;

	for (i = 0; i < MAXVISPLANES; i++)
	{
		for (pl = visplanes[i]; pl; pl = pl->next)
		{
			// kg3D - draw only correct planes
			if(pl->CurrentSkybox != CurrentSkybox || pl->CurrentPortalUniq != CurrentPortalUniq)
				continue;
			if(pl->sky < 0 && pl->height.Zat0() == height) {
				ViewPos = pl->viewpos;
				ViewAngle = pl->viewangle;
				MirrorFlags = pl->MirrorFlags;
				R_DrawSinglePlane (pl, pl->sky & 0x7FFFFFFF, pl->Additive, true);
			}
		}
	}
	ViewPos = oViewPos;
	ViewAngle = oViewAngle;
}